

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

string * __thiscall
symbols::IntObject::toString_abi_cxx11_(string *__return_storage_ptr__,IntObject *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,this->value);
  return __return_storage_ptr__;
}

Assistant:

std::string IntObject::toString() const
{
   return std::to_string(value);
}